

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToOneInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToOneInstance *this,
          ConstPixelBufferAccess *alphaOneImage,ConstPixelBufferAccess *noAlphaOneImage)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ostream *stream;
  int iVar4;
  int z;
  int iVar5;
  undefined1 auVar6 [16];
  Vector<bool,_4> res;
  ostringstream message;
  ConstPixelBufferAccess local_1e8;
  string *local_1c0;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar5 = (this->m_renderSize).m_data[1];
  if (0 < iVar5) {
    local_1c0 = (string *)&__return_storage_ptr__->m_description;
    local_1e8.m_data = &(__return_storage_ptr__->m_description).field_2;
    iVar4 = (this->m_renderSize).m_data[0];
    z = 0;
    do {
      if (0 < iVar4) {
        iVar5 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1a8,(int)alphaOneImage,iVar5,z);
          tcu::ConstPixelBufferAccess::getPixel(&local_1e8,(int)noAlphaOneImage,iVar5,z);
          auVar6._4_4_ = -(uint)((float)local_1e8.m_format.type <= (float)local_1a8._4_4_);
          auVar6._0_4_ = -(uint)((float)local_1e8.m_format.order <= (float)local_1a8._0_4_);
          auVar6._8_4_ = -(uint)((float)local_1e8.m_size.m_data[0] <= (float)local_1a8._8_4_);
          auVar6._12_4_ = -(uint)((float)local_1e8.m_size.m_data[1] <= (float)local_1a8._12_4_);
          auVar6 = packssdw(auVar6,auVar6);
          auVar6 = packsswb(auVar6,auVar6);
          local_1b8._0_4_ = auVar6._0_4_ & (ChannelOrder)DAT_00a98960;
          if ((char)local_1b8._0_4_ == '\0') {
LAB_004ae64f:
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsatisfied condition: ",0x17);
            tcu::ConstPixelBufferAccess::getPixel(&local_1e8,(int)alphaOneImage,iVar5,z);
            stream = tcu::operator<<((ostream *)local_1a8,(Vector<float,_4> *)&local_1e8);
            std::__ostream_insert<char,std::char_traits<char>>(stream," >= ",4);
            tcu::ConstPixelBufferAccess::getPixel
                      ((ConstPixelBufferAccess *)local_1b8,(int)noAlphaOneImage,iVar5,z);
            tcu::operator<<(stream,(Vector<float,_4> *)local_1b8);
            std::__cxx11::stringbuf::str();
            __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
            (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_1e8.m_data;
            std::__cxx11::string::_M_construct<char*>
                      (local_1c0,CONCAT44(local_1e8.m_format.type,local_1e8.m_format.order),
                       CONCAT44(local_1e8.m_size.m_data[1],local_1e8.m_size.m_data[0]) +
                       CONCAT44(local_1e8.m_format.type,local_1e8.m_format.order));
            if ((int *)CONCAT44(local_1e8.m_format.type,local_1e8.m_format.order) !=
                local_1e8.m_size.m_data + 2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_1e8.m_format.type,local_1e8.m_format.order),
                              local_1e8._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            return __return_storage_ptr__;
          }
          uVar3 = 0xffffffffffffffff;
          do {
            if (uVar3 == 2) goto LAB_004ae5c6;
            uVar1 = uVar3 + 1;
            lVar2 = uVar3 + 2;
            uVar3 = uVar1;
          } while (local_1b8[lVar2] != '\0');
          if (uVar1 < 3) goto LAB_004ae64f;
LAB_004ae5c6:
          iVar5 = iVar5 + 1;
          iVar4 = (this->m_renderSize).m_data[0];
        } while (iVar5 < iVar4);
        iVar5 = (this->m_renderSize).m_data[1];
      }
      z = z + 1;
    } while (z < iVar5);
  }
  local_1a8._0_8_ = (long)local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,
             "Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one"
             ,"");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1a8._0_8_,
             (undefined1 *)(CONCAT44(local_1a8._12_4_,local_1a8._8_4_) + local_1a8._0_8_));
  if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus AlphaToOneInstance::verifyImage (const tcu::ConstPixelBufferAccess&	alphaOneImage,
												 const tcu::ConstPixelBufferAccess&	noAlphaOneImage)
{
	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (!tcu::boolAll(tcu::greaterThanEqual(alphaOneImage.getPixel(x, y), noAlphaOneImage.getPixel(x, y))))
			{
				std::ostringstream message;
				message << "Unsatisfied condition: " << alphaOneImage.getPixel(x, y) << " >= " << noAlphaOneImage.getPixel(x, y);
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image rendered with alpha-to-one contains pixels of image rendered with no alpha-to-one");
}